

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O1

bool __thiscall QJsonPrivate::Parser::parseString(Parser *this)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  char16_t *data;
  bool bVar10;
  int iVar11;
  QFlagsStorage<QtCbor::Element::ValueFlag> extraFlags;
  byte bVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QString local_58;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar7 = (byte *)this->json;
  bVar13 = true;
  bVar10 = true;
  pbVar9 = pbVar7;
  do {
    if (this->end <= pbVar9) goto LAB_001162e6;
    bVar12 = *pbVar9;
    iVar11 = 3;
    pbVar8 = pbVar9;
    if (bVar12 != 0x22) {
      if (bVar12 == 0x5c) {
        bVar10 = false;
        bVar13 = false;
      }
      else {
        pbVar8 = pbVar9 + 1;
        bVar2 = true;
        if ((char)bVar12 < '\0') {
          if ((((bVar12 < 0xc2) || (bVar12 < 0xe0)) || (bVar2 = false, bVar12 < 0xf0)) ||
             (bVar12 < 0xf5)) {
            bVar12 = 0;
            bVar2 = false;
          }
          else {
            bVar12 = 0;
          }
        }
        if (bVar2) {
          this->json = (char *)pbVar8;
          iVar11 = 0;
          if (0x7f < bVar12) {
            bVar13 = false;
          }
        }
        else {
          this->lastError = IllegalUTF8String;
          iVar11 = 1;
          pbVar8 = pbVar9;
        }
      }
    }
    pbVar9 = pbVar8;
  } while (iVar11 == 0);
  if (iVar11 == 3) {
LAB_001162e6:
    pbVar9 = (byte *)(this->json + 1);
    this->json = (char *)pbVar9;
    if (pbVar9 <= this->end) {
      if (bVar10) {
        if (bVar13) {
          extraFlags.i = 8;
        }
        else {
          extraFlags.i = 0;
        }
        QCborContainerPrivate::appendByteData
                  ((this->container).d.ptr,(char *)pbVar7,(qsizetype)(pbVar9 + ~(ulong)pbVar7),
                   String,(ValueFlags)extraFlags.i);
        bVar13 = true;
        goto LAB_001166d6;
      }
      this->json = (char *)pbVar7;
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
      do {
        pbVar7 = (byte *)this->json;
        pbVar9 = (byte *)this->end;
        if (pbVar9 <= pbVar7) goto LAB_0011665e;
        bVar12 = *pbVar7;
        if (bVar12 == 0x22) {
          iVar11 = 5;
        }
        else {
          if (bVar12 == 0x5c) {
            this->json = (char *)(pbVar7 + 1);
            uVar5 = 0;
            bVar13 = false;
            if (pbVar7 + 1 < pbVar9) {
              this->json = (char *)(pbVar7 + 2);
              bVar12 = pbVar7[1];
              uVar5 = (ulong)bVar12;
              bVar13 = true;
              if (bVar12 < 0x62) {
                if (bVar12 != 0x22) {
                  if (bVar12 == 0x2f) {
                    uVar5 = 0x2f;
                  }
                  else if (bVar12 == 0x5c) {
                    uVar5 = 0x5c;
                  }
                }
              }
              else {
                switch(bVar12) {
                case 0x6e:
                  uVar5 = 10;
                  break;
                case 0x6f:
                case 0x70:
                case 0x71:
                case 0x73:
                  break;
                case 0x72:
                  uVar5 = 0xd;
                  break;
                case 0x74:
                  uVar5 = 9;
                  break;
                case 0x75:
                  uVar5 = 0;
                  bVar13 = false;
                  if (pbVar7 + 2 <= pbVar9 + -4) {
                    pbVar7 = pbVar7 + 3;
                    uVar5 = 0;
                    bVar13 = false;
                    uVar4 = 0;
                    do {
                      iVar11 = (int)(char)pbVar7[-1];
                      uVar6 = iVar11 - 0x30;
                      if (9 < uVar6) {
                        if (iVar11 - 0x41U < 6) {
                          uVar6 = iVar11 - 0x37;
                        }
                        else {
                          uVar6 = iVar11 - 0x57;
                          if (5 < iVar11 - 0x61U) {
                            uVar6 = 0xffffffff;
                          }
                        }
                      }
                      uVar3 = (int)uVar5 << 4;
                      uVar5 = (ulong)uVar3;
                      if (uVar6 == 0xffffffff) break;
                      uVar5 = (ulong)(uVar3 | uVar6);
                      this->json = (char *)pbVar7;
                      bVar13 = 2 < uVar4;
                      uVar4 = uVar4 + 1;
                      pbVar7 = pbVar7 + 1;
                    } while (uVar4 != 4);
                  }
                  break;
                default:
                  if (bVar12 == 0x62) {
                    uVar5 = 8;
                  }
                  else if (bVar12 == 0x66) {
                    uVar5 = 0xc;
                  }
                }
              }
            }
            if (!bVar13) {
              this->lastError = IllegalEscapeSequence;
LAB_00116622:
              iVar11 = 1;
              goto LAB_0011664f;
            }
          }
          else {
            bVar13 = true;
            if ((char)bVar12 < '\0') {
              if (((bVar12 < 0xc2) || (bVar12 < 0xe0)) ||
                 ((bVar13 = false, bVar12 < 0xf0 || (bVar12 < 0xf5)))) {
                uVar5 = 0;
                bVar13 = false;
              }
              else {
                uVar5 = 0;
              }
            }
            else {
              uVar5 = (ulong)bVar12;
            }
            if (!bVar13) {
              this->lastError = IllegalUTF8String;
              goto LAB_00116622;
            }
            this->json = (char *)(pbVar7 + 1);
          }
          iVar11 = 0;
          uVar4 = (uint)uVar5;
          if (uVar4 < 0x10000) {
            uVar6 = 0;
          }
          else {
            uVar6 = (uVar4 & 0x3ff) << 0x10 | 0xdc000000;
            uVar4 = (int)(uVar5 >> 10) + 0xd7c0;
          }
          local_3c._2_2_ = (short)(uVar6 >> 0x10);
          bVar13 = local_3c._2_2_ == 0;
          local_3c = uVar4 & 0xffff | uVar6;
          QString::append(&local_58,(QChar *)&local_3c,2 - (ulong)bVar13);
        }
LAB_0011664f:
      } while (iVar11 == 0);
      if (iVar11 == 5) {
LAB_0011665e:
        pcVar1 = this->json;
        this->json = pcVar1 + 1;
        if (this->end < pcVar1 + 1) {
          this->lastError = UnterminatedString;
          goto LAB_00116676;
        }
        data = local_58.d.ptr;
        if (local_58.d.ptr == (char16_t *)0x0) {
          data = L"";
        }
        QCborContainerPrivate::appendByteData
                  ((this->container).d.ptr,(char *)data,local_58.d.size * 2,String,(ValueFlags)0x4);
        bVar13 = true;
      }
      else {
LAB_00116676:
        bVar13 = false;
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_001166d6;
    }
    this->lastError = UnterminatedString;
  }
  bVar13 = false;
LAB_001166d6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar13;
}

Assistant:

bool Parser::parseString()
{
    const char *start = json;

    // try to parse a utf-8 string without escape sequences, and note whether it's 7bit ASCII.

    bool isUtf8 = true;
    bool isAscii = true;
    while (json < end) {
        char32_t ch = 0;
        if (*json == '"')
            break;
        if (*json == '\\') {
            isAscii = false;
            // If we find escape sequences, we store UTF-16 as there are some
            // escape sequences which are hard to represent in UTF-8.
            // (plain "\\ud800" for example)
            isUtf8 = false;
            break;
        }
        if (!scanUtf8Char(json, end, &ch)) {
            lastError = QJsonParseError::IllegalUTF8String;
            return false;
        }
        if (ch > 0x7f)
            isAscii = false;
    }
    ++json;
    if (json > end) {
        lastError = QJsonParseError::UnterminatedString;
        return false;
    }

    // no escape sequences, we are done
    if (isUtf8) {
        if (isAscii)
            container->appendAsciiString(start, json - start - 1);
        else
            container->appendUtf8String(start, json - start - 1);
        return true;
    }

    json = start;

    QString ucs4;
    while (json < end) {
        char32_t ch = 0;
        if (*json == '"')
            break;
        else if (*json == '\\') {
            if (!scanEscapeSequence(json, end, &ch)) {
                lastError = QJsonParseError::IllegalEscapeSequence;
                return false;
            }
        } else {
            if (!scanUtf8Char(json, end, &ch)) {
                lastError = QJsonParseError::IllegalUTF8String;
                return false;
            }
        }
        ucs4.append(QChar::fromUcs4(ch));
    }
    ++json;

    if (json > end) {
        lastError = QJsonParseError::UnterminatedString;
        return false;
    }

    container->appendByteData(reinterpret_cast<const char *>(ucs4.constData()), ucs4.size() * 2,
                              QCborValue::String, QtCbor::Element::StringIsUtf16);
    return true;
}